

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::buildAccess
          (String *__return_storage_ptr__,ShaderStorageBufferLayoutBindingCase *this,String *var)

{
  ostream *poVar1;
  ostringstream s;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"vec4(0.0, ");
  poVar1 = std::operator<<(poVar1,(string *)var);
  poVar1 = std::operator<<(poVar1,"_a[0] + ");
  poVar1 = std::operator<<(poVar1,(string *)var);
  std::operator<<(poVar1,"_a[1], 0.0, 1.0)");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

String buildAccess(const String& var)
	{
		std::ostringstream s;
		s << "vec4(0.0, " << var << "_a[0] + " << var << "_a[1], 0.0, 1.0)";
		return s.str();
	}